

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaCurrentBudgetData::RemoveAllocation
          (VmaCurrentBudgetData *this,uint32_t heapIndex,VkDeviceSize allocationSize)

{
  __int_type_conflict2 in_RDX;
  uint in_ESI;
  long in_RDI;
  
  std::__atomic_base<unsigned_long>::operator-=
            ((__atomic_base<unsigned_long> *)(in_RDI + 0x100 + (ulong)in_ESI * 8),in_RDX);
  std::__atomic_base<unsigned_int>::operator--
            ((__atomic_base<unsigned_int> *)(in_RDI + 0x40 + (ulong)in_ESI * 4));
  std::__atomic_base<unsigned_int>::operator++((__atomic_base<unsigned_int> *)(in_RDI + 0x180));
  return;
}

Assistant:

void VmaCurrentBudgetData::RemoveAllocation(uint32_t heapIndex, VkDeviceSize allocationSize)
{
    VMA_ASSERT(m_AllocationBytes[heapIndex] >= allocationSize);
    m_AllocationBytes[heapIndex] -= allocationSize;
    VMA_ASSERT(m_AllocationCount[heapIndex] > 0);
    --m_AllocationCount[heapIndex];
#if VMA_MEMORY_BUDGET
    ++m_OperationsSinceBudgetFetch;
#endif
}